

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

String * kj::_::generateExtensionRequest
                   (String *__return_storage_ptr__,ArrayPtr<kj::CompressionParameters> *extensions)

{
  size_t sVar1;
  size_t sVar2;
  CompressionParameters *pCVar3;
  long lVar4;
  undefined8 *puVar5;
  void *pvVar6;
  String *pSVar7;
  char *pcVar8;
  code *params_1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  code *params_2;
  long lVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar11;
  String result;
  Array<kj::String> offers;
  unsigned_long w;
  String local_70;
  void *local_58;
  size_t sStack_50;
  undefined8 *local_48;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_40;
  String *local_38;
  
  sVar1 = extensions->size_;
  params_1 = HeapArrayDisposer::Allocate_<kj::String>::construct;
  params_2 = ArrayDisposer::Dispose_<kj::String>::destruct;
  local_38 = __return_storage_ptr__;
  local_58 = HeapArrayDisposer::allocateImpl
                       (0x18,sVar1,sVar1,HeapArrayDisposer::Allocate_<kj::String>::construct,
                        ArrayDisposer::Dispose_<kj::String>::destruct);
  local_48 = &HeapArrayDisposer::instance;
  sVar2 = extensions->size_;
  sStack_50 = sVar1;
  if (sVar2 != 0) {
    pCVar3 = extensions->ptr;
    lVar10 = 0;
    paVar11 = &(pCVar3->inboundMaxWindowBits).ptr.field_1;
    do {
      heapString(&local_70,0x12);
      pvVar6 = local_58;
      pcVar8 = (char *)local_70.content.size_;
      if ((char *)local_70.content.size_ != (char *)0x0) {
        pcVar8 = local_70.content.ptr;
      }
      builtin_strncpy(pcVar8,"permessage-deflate",0x12);
      lVar4 = *(long *)((long)local_58 + lVar10);
      if (lVar4 != 0) {
        params_1 = *(code **)((long)local_58 + lVar10 + 8);
        *(undefined8 *)((long)local_58 + lVar10) = 0;
        ((undefined8 *)((long)local_58 + lVar10))[1] = 0;
        puVar5 = *(undefined8 **)((long)local_58 + lVar10 + 0x10);
        params_2 = params_1;
        (**(code **)*puVar5)(puVar5,lVar4,1,params_1,params_1,0);
      }
      *(char **)((long)pvVar6 + lVar10) = local_70.content.ptr;
      *(size_t *)((long)pvVar6 + lVar10 + 8) = local_70.content.size_;
      *(ArrayDisposer **)((long)pvVar6 + lVar10 + 0x10) = local_70.content.disposer;
      if (*(char *)(paVar11 + -4) == '\x01') {
        str<kj::String&,char_const(&)[29]>
                  (&local_70,(kj *)((long)local_58 + lVar10),(String *)0x4d6c5c,
                   (char (*) [29])params_1);
        pvVar6 = local_58;
        lVar4 = *(long *)((long)local_58 + lVar10);
        if (lVar4 != 0) {
          params_1 = *(code **)((long)local_58 + lVar10 + 8);
          *(undefined8 *)((long)local_58 + lVar10) = 0;
          ((undefined8 *)((long)local_58 + lVar10))[1] = 0;
          puVar5 = *(undefined8 **)((long)local_58 + lVar10 + 0x10);
          params_2 = params_1;
          (**(code **)*puVar5)(puVar5,lVar4,1);
        }
        *(char **)((long)pvVar6 + lVar10) = local_70.content.ptr;
        *(size_t *)((long)pvVar6 + lVar10 + 8) = local_70.content.size_;
        *(ArrayDisposer **)((long)pvVar6 + lVar10 + 0x10) = local_70.content.disposer;
      }
      if (*(char *)((long)paVar11 + -0x1f) == '\x01') {
        str<kj::String&,char_const(&)[29]>
                  (&local_70,(kj *)((long)local_58 + lVar10),(String *)0x4d5c73,
                   (char (*) [29])params_1);
        pvVar6 = local_58;
        lVar4 = *(long *)((long)local_58 + lVar10);
        if (lVar4 != 0) {
          params_1 = *(code **)((long)local_58 + lVar10 + 8);
          *(undefined8 *)((long)local_58 + lVar10) = 0;
          ((undefined8 *)((long)local_58 + lVar10))[1] = 0;
          puVar5 = *(undefined8 **)((long)local_58 + lVar10 + 0x10);
          params_2 = params_1;
          (**(code **)*puVar5)(puVar5,lVar4,1);
        }
        *(char **)((long)pvVar6 + lVar10) = local_70.content.ptr;
        *(size_t *)((long)pvVar6 + lVar10 + 8) = local_70.content.size_;
        *(ArrayDisposer **)((long)pvVar6 + lVar10 + 0x10) = local_70.content.disposer;
      }
      if (*(char *)(paVar11 + -3) == '\x01') {
        local_40 = paVar11[-2];
        params_1 = (code *)&local_40;
        str<kj::String&,char_const(&)[26],unsigned_long&>
                  (&local_70,(kj *)((long)local_58 + lVar10),(String *)"; client_max_window_bits=",
                   (char (*) [26])params_1,(unsigned_long *)params_2);
        pvVar6 = local_58;
        lVar4 = *(long *)((long)local_58 + lVar10);
        if (lVar4 != 0) {
          params_1 = *(code **)((long)local_58 + lVar10 + 8);
          *(undefined8 *)((long)local_58 + lVar10) = 0;
          ((undefined8 *)((long)local_58 + lVar10))[1] = 0;
          puVar5 = *(undefined8 **)((long)local_58 + lVar10 + 0x10);
          params_2 = params_1;
          (**(code **)*puVar5)(puVar5,lVar4,1);
        }
        *(char **)((long)pvVar6 + lVar10) = local_70.content.ptr;
        *(size_t *)((long)pvVar6 + lVar10 + 8) = local_70.content.size_;
        *(ArrayDisposer **)((long)pvVar6 + lVar10 + 0x10) = local_70.content.disposer;
      }
      if (*(char *)(paVar11 + -1) == '\x01') {
        local_40 = *paVar11;
        params_1 = (code *)&local_40;
        str<kj::String&,char_const(&)[26],unsigned_long&>
                  (&local_70,(kj *)((long)local_58 + lVar10),(String *)"; server_max_window_bits=",
                   (char (*) [26])params_1,(unsigned_long *)params_2);
        pvVar6 = local_58;
        lVar4 = *(long *)((long)local_58 + lVar10);
        if (lVar4 != 0) {
          params_1 = *(code **)((long)local_58 + lVar10 + 8);
          *(undefined8 *)((long)local_58 + lVar10) = 0;
          ((undefined8 *)((long)local_58 + lVar10))[1] = 0;
          puVar5 = *(undefined8 **)((long)local_58 + lVar10 + 0x10);
          params_2 = params_1;
          (**(code **)*puVar5)(puVar5,lVar4,1);
        }
        *(char **)((long)pvVar6 + lVar10) = local_70.content.ptr;
        *(size_t *)((long)pvVar6 + lVar10 + 8) = local_70.content.size_;
        *(ArrayDisposer **)((long)pvVar6 + lVar10 + 0x10) = local_70.content.disposer;
      }
      lVar10 = lVar10 + 0x18;
      paVar9 = paVar11 + 1;
      paVar11 = paVar11 + 5;
    } while (paVar9 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                       (pCVar3 + sVar2));
  }
  pSVar7 = local_38;
  strArray<kj::Array<kj::String>&>
            (local_38,(kj *)&local_58,(Array<kj::String> *)", ",(char *)params_1);
  sVar1 = sStack_50;
  pvVar6 = local_58;
  if (local_58 != (void *)0x0) {
    local_58 = (void *)0x0;
    sStack_50 = 0;
    (**(code **)*local_48)
              (local_48,pvVar6,0x18,sVar1,sVar1,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return pSVar7;
}

Assistant:

kj::String generateExtensionRequest(const ArrayPtr<CompressionParameters>& extensions) {
  // Build the `Sec-WebSocket-Extensions` request from the validated parameters.
  constexpr auto EXT = "permessage-deflate"_kj;
  auto offers = kj::heapArray<String>(extensions.size());
  size_t i = 0;
  for (const auto& offer : extensions) {
    offers[i] = kj::str(EXT);
    if (offer.outboundNoContextTakeover) {
      offers[i] = kj::str(offers[i], "; client_no_context_takeover");
    }
    if (offer.inboundNoContextTakeover) {
      offers[i] = kj::str(offers[i], "; server_no_context_takeover");
    }
    if (offer.outboundMaxWindowBits != kj::none) {
      auto w = KJ_ASSERT_NONNULL(offer.outboundMaxWindowBits);
      offers[i] = kj::str(offers[i], "; client_max_window_bits=", w);
    }
    if (offer.inboundMaxWindowBits != kj::none) {
      auto w = KJ_ASSERT_NONNULL(offer.inboundMaxWindowBits);
      offers[i] = kj::str(offers[i], "; server_max_window_bits=", w);
    }
    ++i;
  }
  return kj::strArray(offers, ", ");
}